

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_gga_inc.c
# Opt level: O1

void work_gga_exc_unpol(xc_func_type *p,size_t np,double *rho,double *sigma,xc_gga_out_params *out)

{
  hyb_gga_xc_case21_params *params;
  double *pdVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double __x;
  double dVar16;
  
  if (np != 0) {
    sVar3 = 0;
    do {
      if (p->nspin == 2) {
        lVar2 = (long)(p->dim).rho * sVar3;
        dVar5 = rho[lVar2] + rho[lVar2 + 1];
      }
      else {
        dVar5 = rho[(long)(p->dim).rho * sVar3];
      }
      dVar11 = p->dens_threshold;
      if (dVar11 <= dVar5) {
        dVar5 = rho[(long)(p->dim).rho * sVar3];
        if (rho[(long)(p->dim).rho * sVar3] <= dVar11) {
          dVar5 = dVar11;
        }
        dVar6 = p->sigma_threshold * p->sigma_threshold;
        params = (hyb_gga_xc_case21_params *)p->params;
        dVar12 = 1.0 - params->ax;
        dVar15 = sigma[(long)(p->dim).sigma * sVar3];
        if (sigma[(long)(p->dim).sigma * sVar3] <= dVar6) {
          dVar15 = dVar6;
        }
        dVar6 = p->zeta_threshold;
        dVar7 = cbrt(dVar6);
        dVar8 = cbrt(dVar5);
        dVar9 = cbrt(9.869604401089358);
        dVar14 = 1.0 / (dVar8 * dVar8);
        dVar9 = (dVar14 / (dVar5 * dVar5)) *
                dVar15 * 1.5874010519681996 *
                params->gammax * 1.8171205928321397 * (1.0 / (dVar9 * dVar9));
        dVar9 = xbspline(((1.0 / (dVar9 / 24.0 + 1.0)) * dVar9) / 24.0,0,params);
        dVar10 = 0.0;
        uVar4 = -(ulong)(1.0 <= dVar6);
        if (dVar11 < dVar5 * 0.5) {
          dVar11 = (double)(~uVar4 & 0x3ff0000000000000 | (ulong)(dVar6 + -1.0 + 1.0) & uVar4);
          dVar10 = cbrt(dVar11);
          dVar10 = dVar9 * (double)(-(ulong)(dVar11 <= dVar6) & (ulong)(dVar6 * dVar7) |
                                   ~-(ulong)(dVar11 <= dVar6) & (ulong)(dVar10 * dVar11)) * dVar8 *
                           -0.36927938319101117;
        }
        dVar9 = cbrt(0.3183098861837907);
        __x = (dVar9 * 1.4422495703074083 * 2.519842099789747) / dVar8;
        dVar16 = SQRT(__x);
        dVar11 = dVar16;
        if (__x < 0.0) {
          dVar11 = sqrt(__x);
        }
        dVar13 = (double)(~uVar4 & 0x4000a402fcc79298 |
                         (ulong)(dVar7 * dVar7 * 2.080083823051904) & uVar4);
        dVar5 = (1.0 / dVar8) / (dVar5 * dVar5);
        if (__x < 0.0) {
          dVar16 = sqrt(__x);
        }
        dVar14 = dVar14 * dVar9 * dVar9 * 2.080083823051904 * 1.5874010519681996;
        dVar8 = log(16.081979498692537 /
                    (dVar14 * 0.123235 + dVar16 * __x * 0.204775 + dVar11 * 3.79785 + __x * 0.8969)
                    + 1.0);
        dVar6 = (double)(~uVar4 & 0x3ff0000000000000 | (ulong)(dVar6 * dVar7) & uVar4);
        dVar11 = log(29.608749977793437 /
                     (dVar14 * 0.1241775 +
                     dVar16 * __x * 0.1100325 + dVar11 * 5.1785 + __x * 0.905775) + 1.0);
        dVar11 = (__x * 0.053425 + 1.0) * -0.0621814 * dVar8 +
                 ((dVar6 + dVar6 + -2.0) / 0.5198420997897464) * 0.0197516734986138 *
                 (__x * 0.0278125 + 1.0) * dVar11;
        dVar5 = cbspline((dVar13 * 1.4645918875615234 * dVar15 * dVar5 *
                         (1.0 / (params->gammac * dVar11 +
                                (dVar5 * dVar15 * 1.4645918875615234 * dVar13) / -48.0))) / -48.0,0,
                         params);
        pdVar1 = out->zk;
        if ((pdVar1 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          lVar2 = (long)(p->dim).zk * sVar3;
          pdVar1[lVar2] = dVar5 * dVar11 + (dVar12 + dVar12) * dVar10 + pdVar1[lVar2];
        }
      }
      sVar3 = sVar3 + 1;
    } while (np != sVar3);
  }
  return;
}

Assistant:

static void
WORK_GGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, const double *sigma,
         xc_gga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};
  double my_sigma[3] = {0.0, 0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));
    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, out);
    
    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 %le 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(sigma, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le %le %le %le 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1),
                 VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2));
        }
      }
    }
#endif
  }   /* for(ip) */

}